

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::accumulateDerivativesDispatch1<false>
          (BeagleCPUImpl<double,_1,_0> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if (outSumDerivatives == (double *)0x0) {
    BeagleCPUImpl<double,1,0>::accumulateDerivativesDispatch2<false,false>
              ((BeagleCPUImpl<double,1,0> *)this,outDerivatives,(double *)0x0,
               outSumSquaredDerivatives);
    return;
  }
  if (outSumSquaredDerivatives != (double *)0x0) {
    auVar2 = ZEXT816(0) << 0x40;
    auVar3 = ZEXT816(0) << 0x40;
    uVar1 = 0;
    while ((uint)(~(this->kPatternCount >> 0x1f) & this->kPatternCount) != uVar1) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = this->gPatternWeights[uVar1];
      auVar4._0_8_ = this->grandNumeratorDerivTmp[uVar1] / this->grandDenominatorDerivTmp[uVar1];
      auVar4._8_8_ = 0;
      uVar1 = uVar1 + 1;
      auVar3 = vfmadd231sd_fma(auVar3,auVar4,auVar6);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = auVar4._0_8_ * auVar4._0_8_;
      auVar2 = vfmadd231sd_fma(auVar2,auVar6,auVar5);
    }
    *outSumDerivatives = auVar3._0_8_;
    *outSumSquaredDerivatives = auVar2._0_8_;
    return;
  }
  BeagleCPUImpl<double,1,0>::accumulateDerivativesImpl<false,true,false>
            ((BeagleCPUImpl<double,1,0> *)this,outDerivatives,outSumDerivatives,(double *)0x0);
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE template <bool DoDerivatives>
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesDispatch1(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    if (outSumDerivatives == NULL) {
        accumulateDerivativesDispatch2<DoDerivatives, false>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    } else {
        accumulateDerivativesDispatch2<DoDerivatives, true>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    }
}